

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::cmNinjaTargetGenerator
          (cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  cmLocalNinjaGenerator *pcVar2;
  mapped_type *pmVar3;
  cmNinjaTargetGenerator *local_70;
  unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
  local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileConfig;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGeneratorTarget *target_local;
  cmNinjaTargetGenerator *this_local;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaTargetGenerator_00f4cf50;
  std::unique_ptr<cmOSXBundleGenerator,std::default_delete<cmOSXBundleGenerator>>::
  unique_ptr<std::default_delete<cmOSXBundleGenerator>,void>
            ((unique_ptr<cmOSXBundleGenerator,std::default_delete<cmOSXBundleGenerator>> *)
             &this->OSXBundleGenerator,(nullptr_t)0x0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->MacContentFolders);
  pcVar2 = (cmLocalNinjaGenerator *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  ::map(&this->Configs);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1,target->Makefile,IncludeEmptyConfig);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  fileConfig = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&fileConfig);
    if (!bVar1) break;
    local_60 = (undefined1  [8])
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_70 = this;
    std::
    make_unique<cmNinjaTargetGenerator::MacOSXContentGeneratorType,cmNinjaTargetGenerator*,std::__cxx11::string_const&>
              ((cmNinjaTargetGenerator **)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](&this->Configs,(key_type *)local_60);
    std::
    unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
    ::operator=(&pmVar3->MacOSXContentGenerator,&local_68);
    std::
    unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
    ::~unique_ptr(&local_68);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1);
  return;
}

Assistant:

cmNinjaTargetGenerator::cmNinjaTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
  , OSXBundleGenerator(nullptr)
  , LocalGenerator(
      static_cast<cmLocalNinjaGenerator*>(target->GetLocalGenerator()))
{
  for (auto const& fileConfig :
       target->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig)) {
    this->Configs[fileConfig].MacOSXContentGenerator =
      cm::make_unique<MacOSXContentGeneratorType>(this, fileConfig);
  }
}